

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O0

void __thiscall fmp4_stream::tfhd::parse(tfhd *this,char *ptr)

{
  uint32_t uVar1;
  uint local_1c;
  uint offset;
  char *ptr_local;
  tfhd *this_local;
  
  full_box::parse(&this->super_full_box,ptr);
  uVar1 = anon_unknown.dwarf_11f6e1::fmp4_read_uint32(ptr + 0xc);
  this->track_id_ = uVar1;
  (this->super_full_box).field_0x6c =
       (*(uint *)&(this->super_full_box).super_box.field_0x64 & 1) != 0;
  (this->super_full_box).field_0x6d =
       (*(uint *)&(this->super_full_box).super_box.field_0x64 & 2) != 0;
  (this->super_full_box).field_0x6e =
       (*(uint *)&(this->super_full_box).super_box.field_0x64 & 8) != 0;
  (this->super_full_box).field_0x6f =
       (*(uint *)&(this->super_full_box).super_box.field_0x64 & 0x10) != 0;
  this->default_sample_flags_present_ =
       (*(uint *)&(this->super_full_box).super_box.field_0x64 & 0x20) != 0;
  this->duration_is_empty_ = (*(uint *)&(this->super_full_box).super_box.field_0x64 & 0x10000) != 0;
  this->default_base_is_moof_ =
       (*(uint *)&(this->super_full_box).super_box.field_0x64 & 0x20000) != 0;
  local_1c = 0x10;
  if (((this->super_full_box).field_0x6c & 1) != 0) {
    uVar1 = anon_unknown.dwarf_11f6e1::fmp4_read_uint32(ptr + 0x10);
    this->base_data_offset_ = (ulong)uVar1;
    local_1c = 0x14;
  }
  if (((this->super_full_box).field_0x6d & 1) != 0) {
    uVar1 = anon_unknown.dwarf_11f6e1::fmp4_read_uint32(ptr + local_1c);
    this->sample_description_index_ = uVar1;
    local_1c = local_1c + 4;
  }
  if (((this->super_full_box).field_0x6e & 1) != 0) {
    uVar1 = anon_unknown.dwarf_11f6e1::fmp4_read_uint32(ptr + local_1c);
    this->default_sample_duration_ = uVar1;
    local_1c = local_1c + 4;
  }
  if (((this->super_full_box).field_0x6f & 1) != 0) {
    uVar1 = anon_unknown.dwarf_11f6e1::fmp4_read_uint32(ptr + local_1c);
    this->default_sample_size_ = uVar1;
    local_1c = local_1c + 4;
  }
  if ((this->default_sample_flags_present_ & 1U) != 0) {
    uVar1 = anon_unknown.dwarf_11f6e1::fmp4_read_uint32(ptr + local_1c);
    this->default_sample_flags_ = uVar1;
  }
  return;
}

Assistant:

void tfhd::parse(const char * ptr)
	{
		full_box::parse(ptr);
		track_id_ = fmp4_read_uint32(ptr + 12);
		base_data_offset_present_ = !! (0x1u) & flags_;
		sample_description_index_present_ = !!(0x2u & flags_);
		default_sample_duration_present_ = !!(0x00000008u & flags_);
		default_sample_size_present_ = !!(0x00000010u & flags_);
		default_sample_flags_present_ = !!(0x00000020u & flags_);
		duration_is_empty_ = !!(0x00010000u & flags_);
		default_base_is_moof_ = !!(0x00020000u & flags_);

		unsigned int offset = 16;

		if (base_data_offset_present_)
		{
			base_data_offset_ = fmp4_read_uint32(ptr + offset);
			offset += 4;
		}
		if (sample_description_index_present_)
		{
			sample_description_index_ = fmp4_read_uint32(ptr + offset);
			offset += 4;
		}
		if (default_sample_duration_present_)
		{
			default_sample_duration_ = fmp4_read_uint32(ptr + offset);
			offset += 4;
		}
		if (default_sample_size_present_)
		{
			default_sample_size_ = fmp4_read_uint32(ptr + offset);
			offset += 4;
		}
		if (default_sample_flags_present_)
		{
			default_sample_flags_ = (uint32_t)fmp4_read_uint32(ptr + offset);
			offset += 4;
		}
	}